

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O1

bool dxil_spv::analyze_dxil_buffer_access_instruction(Impl *impl,CallInst *instruction)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  TypeID TVar4;
  uint uVar5;
  Value *pVVar6;
  mapped_type *pmVar7;
  _Hash_node_base *p_Var8;
  Type *pTVar9;
  RawBufferMeta RVar10;
  __hash_code __code;
  ulong uVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  AccessTracking *tracking;
  uint32_t opcode;
  Op local_2c;
  
  bVar2 = get_constant_operand(&instruction->super_Instruction,0,&local_2c);
  if (!bVar2) {
    return bVar2;
  }
  if ((int)local_2c < 0x8b) {
    switch(local_2c) {
    case TextureStore:
    case BufferStore:
      goto switchD_0015b782_caseD_43;
    case BufferLoad:
switchD_0015b782_caseD_44:
      analyze_dxil_buffer_load(impl,instruction,local_2c);
      return bVar2;
    case BufferUpdateCounter:
      pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      uVar1 = (impl->llvm_value_to_uav_resource_index_map)._M_h._M_bucket_count;
      uVar11 = (ulong)pVVar6 % uVar1;
      p_Var12 = (impl->llvm_value_to_uav_resource_index_map)._M_h._M_buckets[uVar11];
      p_Var13 = (__node_base_ptr)0x0;
      if ((p_Var12 != (__node_base_ptr)0x0) &&
         (p_Var8 = p_Var12->_M_nxt, p_Var13 = p_Var12, pVVar6 != (Value *)p_Var12->_M_nxt[1]._M_nxt)
         ) {
        while (p_Var12 = p_Var8, p_Var8 = p_Var12->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
          p_Var13 = (__node_base_ptr)0x0;
          if (((ulong)p_Var8[1]._M_nxt % uVar1 != uVar11) ||
             (p_Var13 = p_Var12, pVVar6 == (Value *)p_Var8[1]._M_nxt)) goto LAB_0015ba0e;
        }
        p_Var13 = (__node_base_ptr)0x0;
      }
LAB_0015ba0e:
      if (p_Var13 == (__node_base_ptr)0x0) {
        p_Var8 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var8 = p_Var13->_M_nxt;
      }
      if (p_Var8 == (_Hash_node_base *)0x0) {
        pmVar7 = (mapped_type *)0x0;
      }
      else {
        pmVar7 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&impl->uav_access_tracking,(key_type *)(p_Var8 + 2));
      }
      if (pmVar7 == (mapped_type *)0x0) {
        return bVar2;
      }
      pmVar7->has_counter = true;
      return bVar2;
    default:
      return bVar2;
    case AtomicBinOp:
    case AtomicCompareExchange:
      goto switchD_0015b782_caseD_4e;
    }
  }
  if (3 < local_2c - WriteSamplerFeedback) {
    if (local_2c != RawBufferStore) {
      if (local_2c != RawBufferLoad) {
        return bVar2;
      }
      goto switchD_0015b782_caseD_44;
    }
switchD_0015b782_caseD_43:
    analyze_dxil_buffer_store(impl,instruction,local_2c);
    return bVar2;
  }
switchD_0015b782_caseD_4e:
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  uVar1 = (impl->llvm_value_to_uav_resource_index_map)._M_h._M_bucket_count;
  uVar11 = (ulong)pVVar6 % uVar1;
  p_Var12 = (impl->llvm_value_to_uav_resource_index_map)._M_h._M_buckets[uVar11];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var12->_M_nxt, p_Var13 = p_Var12, pVVar6 != (Value *)p_Var12->_M_nxt[1]._M_nxt)) {
    while (p_Var12 = p_Var8, p_Var8 = p_Var12->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var8[1]._M_nxt % uVar1 != uVar11) ||
         (p_Var13 = p_Var12, pVVar6 == (Value *)p_Var8[1]._M_nxt)) goto LAB_0015b8ad;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_0015b8ad:
  if (p_Var13 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var13->_M_nxt;
  }
  if (p_Var8 == (_Hash_node_base *)0x0) {
    pmVar7 = (mapped_type *)0x0;
  }
  else {
    if ((*(uint32_t *)&p_Var8[2]._M_nxt == (impl->ags).uav_magic_resource_type_index) &&
       (bVar3 = value_is_dx_op_instrinsic((Value *)instruction,AtomicCompareExchange), bVar3)) {
      Converter::Impl::push_ags_instruction(impl,instruction);
      return bVar2;
    }
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->uav_access_tracking,(key_type *)(p_Var8 + 2));
  }
  pVVar6 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  uVar1 = (impl->llvm_annotate_handle_uses)._M_h._M_bucket_count;
  uVar11 = (ulong)pVVar6 % uVar1;
  p_Var12 = (impl->llvm_annotate_handle_uses)._M_h._M_buckets[uVar11];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var8 = p_Var12->_M_nxt, p_Var13 = p_Var12, pVVar6 != (Value *)p_Var12->_M_nxt[1]._M_nxt)) {
    while (p_Var12 = p_Var8, p_Var8 = p_Var12->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)p_Var8[1]._M_nxt % uVar1 != uVar11) ||
         (p_Var13 = p_Var12, pVVar6 == (Value *)p_Var8[1]._M_nxt)) goto LAB_0015b976;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_0015b976:
  if (p_Var13 == (__node_base_ptr)0x0) {
    p_Var8 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var8 = p_Var13->_M_nxt;
  }
  tracking = (AccessTracking *)((long)&p_Var8[2]._M_nxt + 7);
  if (p_Var8 == (_Hash_node_base *)0x0) {
    tracking = pmVar7;
  }
  if (tracking == (AccessTracking *)0x0) {
    return bVar2;
  }
  tracking->has_read = true;
  tracking->has_written = true;
  tracking->has_atomic = true;
  pTVar9 = LLVMBC::Value::getType((Value *)instruction);
  TVar4 = LLVMBC::Type::getTypeID(pTVar9);
  if (TVar4 != VoidTyID) {
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar9);
    if (uVar5 != 0x40) goto LAB_0015b9cd;
  }
  tracking->has_atomic_64bit = true;
LAB_0015b9cd:
  RVar10 = get_resource_meta_from_buffer_op(impl,instruction);
  if ((byte)(RVar10.kind - RawBuffer) < 2) {
    pTVar9 = LLVMBC::Value::getType((Value *)instruction);
    update_raw_access_tracking_from_vector_type(tracking,pTVar9,V1);
  }
  (impl->shader_analysis).has_side_effects = true;
  return bVar2;
}

Assistant:

bool analyze_dxil_buffer_access_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// The opcode is encoded as a constant integer.
	uint32_t opcode;
	if (!get_constant_operand(instruction, 0, &opcode))
		return false;

	auto op = static_cast<DXIL::Op>(opcode);

	switch (op)
	{
	case DXIL::Op::BufferLoad:
	case DXIL::Op::RawBufferLoad:
		analyze_dxil_buffer_load(impl, instruction, op);
		break;

	case DXIL::Op::AtomicCompareExchange:
	case DXIL::Op::AtomicBinOp:
	case DXIL::Op::WriteSamplerFeedback:
	case DXIL::Op::WriteSamplerFeedbackBias:
	case DXIL::Op::WriteSamplerFeedbackGrad:
	case DXIL::Op::WriteSamplerFeedbackLevel:
		// Writing sampler feedback is more or less equivalent to an atomic.
		if (!analyze_dxil_atomic_op(impl, instruction))
			return false;
		break;

	case DXIL::Op::TextureStore:
	case DXIL::Op::BufferStore:
	case DXIL::Op::RawBufferStore:
		// TextureStore only needed here to track AGS U64 image atomics.
		analyze_dxil_buffer_store(impl, instruction, op);
		break;

	case DXIL::Op::BufferUpdateCounter:
		analyze_dxil_atomic_counter(impl, instruction);
		break;

	default:
		break;
	}

	return true;
}